

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type.c
# Opt level: O3

value value_create_function_closure(function f,void *c)

{
  value pvVar1;
  function_conflict local_18;
  
  local_18 = f;
  pvVar1 = value_type_create(&local_18,8,0xd);
  if (pvVar1 != (value)0x0) {
    function_bind(local_18,c);
    function_increment_reference(local_18);
  }
  return pvVar1;
}

Assistant:

value value_create_function_closure(function f, void *c)
{
	// TODO: Review this for the lock-free implementation!!
	// The functions should be immutable, maybe the binding should be a new type
	// or the bind should be stored in the value instead of in the function

	value v = value_type_create(&f, sizeof(function), TYPE_FUNCTION);

	if (v != NULL)
	{
		function_bind(f, c);
		function_increment_reference(f);
	}

	return v;
}